

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic12::Run(UnitTest_semantic12 *this)

{
  bool bVar1;
  byte bVar2;
  SemanticException *anon_var_0_1;
  SemanticException *anon_var_0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffc70;
  allocator *this_00;
  allocator *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  allocator local_2d9;
  string local_2d8 [39];
  allocator local_2b1;
  string local_2b0 [55];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [47];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [47];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [47];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [47];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a = -(1 + 1)",&local_31);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a8f96);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"\'Semantic(\"a = -(1 + 1)\")\'",&local_69);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"a = #{1, 2, 3}",&local_99);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a912c);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"\'Semantic(\"a = #{1, 2, 3}\")\'",&local_c1);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"a = #\'str\'",&local_f1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a92c2);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"\'Semantic(\"a = #\'str\'\")\'",&local_119);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"a = not a",&local_149);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a9446);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"\'Semantic(\"a = not a\")\'",&local_171);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"a = -a",&local_1a1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a95ca);
  bVar2 = bVar1 ^ 0xff;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffffc98 = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,"\'Semantic(\"a = -a\")\'",in_stack_fffffffffffffc98);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"a = #a",&local_1f9);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a974e);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_220,"\'Semantic(\"a = #a\")\'",&local_221);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffca0),
                        (string *)in_stack_fffffffffffffc98);
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator((allocator<char> *)&local_221);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"a = -\'str\'",&local_251);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffc70);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  this_00 = &local_279;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_278,"\'{ Semantic(\"a = -\'str\'\"); }\' has no luna::SemanticException",this_00)
  ;
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffca0),
                      (string *)in_stack_fffffffffffffc98);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b0,"a = #1",&local_2b1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffc98);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_00);
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d8,"\'{ Semantic(\"a = #1\"); }\' has no luna::SemanticException",&local_2d9);
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffca0),
                      (string *)in_stack_fffffffffffffc98);
  std::__cxx11::string::~string(local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  return;
}

Assistant:

TEST_CASE(semantic12)
{
    EXPECT_TRUE(Semantic("a = -(1 + 1)"));
    EXPECT_TRUE(Semantic("a = #{1, 2, 3}"));
    EXPECT_TRUE(Semantic("a = #'str'"));
    EXPECT_TRUE(Semantic("a = not a"));
    EXPECT_TRUE(Semantic("a = -a"));
    EXPECT_TRUE(Semantic("a = #a"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = -'str'");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = #1");
    });
}